

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::SlotI1
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 slotId,ProfileId profileId)

{
  code *pcVar1;
  uint32 slotId_00;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  FunctionBody *this_00;
  uint32 local_40;
  RegSlot local_3c;
  uint32 local_38;
  ProfileId local_34;
  OpCode local_32 [3];
  ProfileId profileId_local;
  OpCode op_local;
  
  local_38 = slotId;
  local_34 = profileId;
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x3d);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x694,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_00891be0;
    *puVar3 = 0;
  }
  if (value == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
    if (bVar2) {
      *puVar3 = 0;
      Throw::InternalError();
    }
LAB_00891be0:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  this_00 = this->m_functionWrite;
  if (this_00 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
    if (!bVar2) goto LAB_00891be0;
    *puVar3 = 0;
    this_00 = this->m_functionWrite;
  }
  value_00 = FunctionBody::MapRegSlot(this_00,value);
  if (((8 < op - 0x134) || ((0x141U >> (op - 0x134 & 0x1f) & 1) == 0)) && (op != LdLocalSlot)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x6a6,"(false)",
                                "The specified OpCode is not intended for slot access");
    if (bVar2) {
      *puVar3 = 0;
      goto LAB_00891afc;
    }
    goto LAB_00891be0;
  }
  bVar2 = DynamicProfileInfo::IsEnabled(AggressiveIntTypeSpecPhase,this->m_functionWrite);
  if (bVar2) {
    if (profileId == 0xffff) goto LAB_00891afc;
  }
  else {
    bVar2 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite);
    if (!bVar2 || profileId == 0xffff) goto LAB_00891afc;
  }
  OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
  op = local_32[0];
LAB_00891afc:
  slotId_00 = local_38;
  bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,value_00,local_38);
  if ((!bVar2) &&
     (bVar2 = TryWriteElementSlotI1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                        (this,local_32[0],value_00,slotId_00), !bVar2)) {
    local_40 = slotId_00;
    local_3c = value_00;
    Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32[0],this);
    Data::Write(&this->m_byteCodeData,&local_40,8);
  }
  bVar2 = OpCodeAttr::IsProfiledOp(local_32[0]);
  if (bVar2) {
    Data::Write(&this->m_byteCodeData,&local_34,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::SlotI1(OpCode op, RegSlot value, uint32 slotId, ProfileId profileId)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlotI1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

        switch (op)
        {
            case OpCode::LdLocalSlot:
            case OpCode::LdParamSlot:
            case OpCode::LdLocalObjSlot:
            case OpCode::LdParamObjSlot:
                if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                    profileId != Constants::NoProfileId)
                {
                    OpCodeUtil::ConvertNonCallOpToProfiled(op);
                }
                break;
            default:
            {
                AssertMsg(false, "The specified OpCode is not intended for slot access");
                break;
            }
        }

        MULTISIZE_LAYOUT_WRITE(ElementSlotI1, op, value, slotId);
        if (OpCodeAttr::IsProfiledOp(op))
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }